

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

void __thiscall Minisat::Solver::analyzeFinal(Solver *this,CRef cr,vec<Minisat::Lit> *out_conflict)

{
  uint64_t *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  uint *puVar4;
  ulong in_RAX;
  int iVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  undefined8 uStack_38;
  
  if (out_conflict->data != (Lit *)0x0) {
    out_conflict->sz = 0;
  }
  if ((this->trail_lim).sz != 0) {
    puVar2 = (ulong *)((this->ca).super_RegionAllocator<unsigned_int>.memory + cr);
    uVar9 = *puVar2;
    if (uVar9 >> 0x22 != 0) {
      uVar6 = 0;
      do {
        iVar7 = *(int *)((long)puVar2 + uVar6 * 4 + 8) >> 1;
        if (0 < (this->vardata).data[iVar7].level) {
          (this->seen).data[iVar7] = '\x01';
          uVar9 = *puVar2;
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < uVar9 >> 0x22);
    }
    iVar7 = (this->trail).sz;
    lVar10 = (long)iVar7;
    iVar5 = *(this->trail_lim).data;
    uStack_38 = in_RAX;
    if (iVar5 < iVar7) {
      do {
        iVar7 = (this->trail).data[lVar10 + -1].x;
        iVar8 = iVar7 >> 1;
        if ((this->seen).data[iVar8] != '\0') {
          uVar9 = (ulong)(this->vardata).data[iVar8].reason;
          if (uVar9 == 0xffffffff) {
            uStack_38 = CONCAT44(iVar7,(undefined4)uStack_38) ^ 0x100000000;
            vec<Minisat::Lit>::push(out_conflict,(Lit *)((long)&uStack_38 + 4));
          }
          else {
            puVar4 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
            uVar6 = *(ulong *)(puVar4 + uVar9);
            if ((uint)((uVar6 & 0xfffffffc00000000) != 0x800000000) < (uint)(uVar6 >> 0x22)) {
              puVar3 = (ulong *)(puVar4 + uVar9);
              uVar9 = (ulong)((uVar6 & 0xfffffffc00000000) != 0x800000000);
              do {
                iVar7 = *(int *)((long)puVar3 + uVar9 * 4 + 8) >> 1;
                if (0 < (this->vardata).data[iVar7].level) {
                  (this->seen).data[iVar7] = '\x01';
                  uVar6 = *puVar3;
                }
                uVar9 = uVar9 + 1;
              } while (uVar9 < uVar6 >> 0x22);
            }
            puVar1 = &(this->statistics).solveSteps;
            *puVar1 = *puVar1 + 1;
          }
          (this->seen).data[iVar8] = '\0';
          iVar5 = *(this->trail_lim).data;
        }
        lVar10 = lVar10 + -1;
      } while (iVar5 < lVar10);
      uVar9 = *puVar2;
    }
    if (0x3ffffffff < uVar9) {
      uVar9 = 0;
      do {
        (this->seen).data[*(int *)((long)puVar2 + uVar9 * 4 + 8) >> 1] = '\0';
        uVar9 = uVar9 + 1;
      } while (uVar9 < *puVar2 >> 0x22);
    }
  }
  return;
}

Assistant:

void Solver::analyzeFinal(const CRef cr, vec<Lit> &out_conflict)
{
    out_conflict.clear();

    if (decisionLevel() == 0) return;

    const Clause &c = ca[cr];
    for (int i = 0; i < c.size(); ++i) {
        if (level(var(c[i])) > 0) seen[var(c[i])] = 1;
    }

    for (int i = trail.size() - 1; i >= trail_lim[0]; i--) {
        Var x = var(trail[i]);
        if (seen[x]) {
            if (reason(x) == CRef_Undef) {
                assert(level(x) > 0);
                out_conflict.push(~trail[i]);
            } else {
                const Clause &c = ca[reason(x)];
                for (int j = c.size() == 2 ? 0 : 1; j < c.size(); j++)
                    if (level(var(c[j])) > 0) seen[var(c[j])] = 1;
                statistics.solveSteps++;
            }
            seen[x] = 0;
        }
    }

    for (int i = 0; i < c.size(); ++i) seen[var(c[i])] = 0;
}